

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char cVar1;
  byte bVar2;
  sqlite3 *db;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  void *pvVar6;
  char *z;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  char *zFormat;
  code *xDel;
  long lVar10;
  long lVar11;
  undefined4 uVar12;
  DateTime x;
  DateTime y;
  char zBuf [100];
  DateTime local_100;
  sqlite3_context *local_d0;
  DateTime local_c8;
  char local_98 [104];
  
  if (argc == 0) {
    return;
  }
  pvVar6 = sqlite3ValueText(*argv,'\x01');
  if (pvVar6 == (void *)0x0) {
    return;
  }
  iVar4 = isDate(context,argc + -1,argv + 1,&local_100);
  if (iVar4 != 0) {
    return;
  }
  db = context->pOut->db;
  uVar9 = 1;
  for (lVar10 = 0; *(char *)((long)pvVar6 + lVar10) == '%'; lVar10 = lVar10 + 1) {
    bVar2 = *(byte *)((long)pvVar6 + lVar10 + 1);
    lVar10 = lVar10 + 1;
    if (bVar2 < 100) {
      if (bVar2 < 0x4d) {
        if (bVar2 == 0x25) goto LAB_00191b2f;
        if (bVar2 != 0x48) {
          if (bVar2 != 0x4a) {
            return;
          }
          goto LAB_00191b2b;
        }
      }
      else if (bVar2 < 0x57) {
        if ((bVar2 != 0x4d) && (bVar2 != 0x53)) {
          return;
        }
      }
      else if (bVar2 != 0x57) {
        if (bVar2 != 0x59) {
          return;
        }
        goto switchD_00191adf_caseD_66;
      }
switchD_00191adf_caseD_64:
      uVar9 = uVar9 + 1;
    }
    else {
      switch(bVar2) {
      case 100:
      case 0x6d:
        goto switchD_00191adf_caseD_64;
      case 0x65:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6b:
      case 0x6c:
        goto switchD_00191adf_caseD_65;
      case 0x66:
switchD_00191adf_caseD_66:
        uVar9 = uVar9 + 8;
        break;
      case 0x6a:
        uVar9 = uVar9 + 3;
        break;
      default:
        if (bVar2 == 0x73) {
LAB_00191b2b:
          uVar9 = uVar9 + 0x32;
        }
        else if (bVar2 != 0x77) {
          return;
        }
      }
    }
LAB_00191b2f:
    uVar9 = uVar9 + 1;
  }
  if (*(char *)((long)pvVar6 + lVar10) != '\0') goto LAB_00191b2f;
  if (uVar9 < 100) {
    z = local_98;
  }
  else {
    if ((ulong)(long)db->aLimit[0] < uVar9) {
      context->isError = 0x12;
      sqlite3VdbeMemSetStr
                (context->pOut,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
      return;
    }
    z = (char *)sqlite3DbMallocRawNN(db,(long)(int)uVar9);
    if (z == (char *)0x0) {
      sqlite3_result_error_nomem(context);
      return;
    }
  }
  local_d0 = context;
  computeJD(&local_100);
  computeYMD(&local_100);
  computeHMS(&local_100);
  lVar10 = 0;
  lVar11 = 0;
LAB_00191bc1:
  cVar1 = *(char *)((long)pvVar6 + lVar11);
  if (cVar1 != '%') {
    if (cVar1 == '\0') {
      z[lVar10] = '\0';
      xDel = (_func_void_void_ptr *)0xffffffffffffffff;
      if (z != local_98) {
        xDel = sqlite3MallocSize;
      }
      setResultStrOrError(local_d0,z,-1,'\x01',xDel);
switchD_00191adf_caseD_65:
      return;
    }
    z[lVar10] = cVar1;
    goto LAB_00191bd7;
  }
  bVar2 = *(byte *)((long)pvVar6 + lVar11 + 1);
  lVar11 = lVar11 + 1;
  if (bVar2 < 100) {
    if (bVar2 < 0x53) {
      if (bVar2 == 0x48) {
        uVar9 = (ulong)(uint)local_100.h;
      }
      else {
        if (bVar2 == 0x4a) {
          uVar12 = SUB84((double)local_100.iJD / 86400000.0,0);
          iVar4 = 0x14;
          zFormat = "%.16g";
          goto LAB_00191e8f;
        }
        if (bVar2 != 0x4d) goto switchD_00191c33_caseD_65;
        uVar9 = (ulong)(uint)local_100.m;
      }
    }
    else {
      if (bVar2 != 0x53) {
        if (bVar2 == 0x57) goto switchD_00191c33_caseD_6a;
        if (bVar2 == 0x59) {
          sqlite3_snprintf(5,z + lVar10,"%04d",(ulong)(uint)local_100.Y);
          goto LAB_00191edc;
        }
        goto switchD_00191c33_caseD_65;
      }
      uVar9 = (ulong)(uint)(int)local_100.s;
    }
    goto LAB_00191e4b;
  }
  switch(bVar2) {
  case 100:
    uVar9 = (ulong)(uint)local_100.D;
    goto LAB_00191e4b;
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6b:
  case 0x6c:
    goto switchD_00191c33_caseD_65;
  case 0x66:
    uVar12 = 0x3b645a1d;
    if (local_100.s <= 59.999) {
      uVar12 = SUB84(local_100.s,0);
    }
    iVar4 = 7;
    zFormat = "%06.3f";
LAB_00191e8f:
    sqlite3_snprintf(iVar4,z + lVar10,zFormat,uVar12);
LAB_00191edc:
    sVar8 = strlen(z + lVar10);
    lVar10 = lVar10 + (ulong)((uint)sVar8 & 0x3fffffff);
    break;
  case 0x6a:
switchD_00191c33_caseD_6a:
    local_c8.s = local_100.s;
    local_c8.iJD = local_100.iJD;
    local_c8._40_8_ = local_100._40_8_ & 0xffffffffffffff00;
    local_c8.M = 1;
    local_c8.Y = local_100.Y;
    local_c8.h = local_100.h;
    local_c8.D = 1;
    computeJD(&local_c8);
    auVar3 = SEXT816((local_100.iJD + 43200000) - local_c8.iJD) * SEXT816(0x636ba875fd33dc87);
    iVar4 = (int)(auVar3._8_8_ >> 0x19) - (auVar3._12_4_ >> 0x1f);
    if (bVar2 == 0x57) {
      lVar7 = (local_100.iJD + 43200000) / 86400000;
      auVar3 = SEXT816(lVar7) * SEXT816(0x4924924924924925);
      iVar5 = ((int)(auVar3._8_8_ >> 1) - (auVar3._12_4_ >> 0x1f)) * 7 - (int)lVar7;
      iVar4 = (int)((ulong)((long)(iVar4 + iVar5 + 7) * -0x6db6db6d) >> 0x20) + iVar5 + iVar4 + 7;
      sqlite3_snprintf(3,z + lVar10,"%02d",(ulong)(uint)((iVar4 >> 2) - (iVar4 >> 0x1f)));
      lVar7 = 2;
    }
    else {
      sqlite3_snprintf(4,z + lVar10,"%03d",(ulong)(iVar4 + 1));
      lVar7 = 3;
    }
    lVar10 = lVar10 + lVar7;
    break;
  case 0x6d:
    uVar9 = (ulong)(uint)local_100.M;
LAB_00191e4b:
    sqlite3_snprintf(3,z + lVar10,"%02d",uVar9);
    lVar10 = lVar10 + 2;
    break;
  default:
    if (bVar2 == 0x73) {
      sqlite3_snprintf(0x1e,z + lVar10,"%lld",local_100.iJD / 1000 + -0x3118a36940);
      goto LAB_00191edc;
    }
    if (bVar2 == 0x77) {
      lVar7 = (local_100.iJD + 0x7b98a00) / 86400000;
      auVar3 = SEXT816(lVar7) * SEXT816(0x4924924924924925);
      z[lVar10] = (char)lVar7 + ((char)(auVar3._8_4_ >> 1) - (auVar3[0xf] >> 7)) * -7 + '0';
      goto LAB_00191bd7;
    }
    goto switchD_00191c33_caseD_65;
  }
LAB_00191eef:
  lVar11 = lVar11 + 1;
  goto LAB_00191bc1;
switchD_00191c33_caseD_65:
  z[lVar10] = '%';
LAB_00191bd7:
  lVar10 = lVar10 + 1;
  goto LAB_00191eef;
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  u64 n;
  size_t i,j;
  char *z;
  sqlite3 *db;
  const char *zFmt;
  char zBuf[100];
  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  for(i=0, n=1; zFmt[i]; i++, n++){
    if( zFmt[i]=='%' ){
      switch( zFmt[i+1] ){
        case 'd':
        case 'H':
        case 'm':
        case 'M':
        case 'S':
        case 'W':
          n++;
          /* fall thru */
        case 'w':
        case '%':
          break;
        case 'f':
          n += 8;
          break;
        case 'j':
          n += 3;
          break;
        case 'Y':
          n += 8;
          break;
        case 's':
        case 'J':
          n += 50;
          break;
        default:
          return;  /* ERROR.  return a NULL */
      }
      i++;
    }
  }
  testcase( n==sizeof(zBuf)-1 );
  testcase( n==sizeof(zBuf) );
  testcase( n==(u64)db->aLimit[SQLITE_LIMIT_LENGTH]+1 );
  testcase( n==(u64)db->aLimit[SQLITE_LIMIT_LENGTH] );
  if( n<sizeof(zBuf) ){
    z = zBuf;
  }else if( n>(u64)db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(context);
    return;
  }else{
    z = sqlite3DbMallocRawNN(db, (int)n);
    if( z==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }
  }
  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    if( zFmt[i]!='%' ){
      z[j++] = zFmt[i];
    }else{
      i++;
      switch( zFmt[i] ){
        case 'd':  sqlite3_snprintf(3, &z[j],"%02d",x.D); j+=2; break;
        case 'f': {
          double s = x.s;
          if( s>59.999 ) s = 59.999;
          sqlite3_snprintf(7, &z[j],"%06.3f", s);
          j += sqlite3Strlen30(&z[j]);
          break;
        }
        case 'H':  sqlite3_snprintf(3, &z[j],"%02d",x.h); j+=2; break;
        case 'W': /* Fall thru */
        case 'j': {
          int nDay;             /* Number of days since 1st day of year */
          DateTime y = x;
          y.validJD = 0;
          y.M = 1;
          y.D = 1;
          computeJD(&y);
          nDay = (int)((x.iJD-y.iJD+43200000)/86400000);
          if( zFmt[i]=='W' ){
            int wd;   /* 0=Monday, 1=Tuesday, ... 6=Sunday */
            wd = (int)(((x.iJD+43200000)/86400000)%7);
            sqlite3_snprintf(3, &z[j],"%02d",(nDay+7-wd)/7);
            j += 2;
          }else{
            sqlite3_snprintf(4, &z[j],"%03d",nDay+1);
            j += 3;
          }
          break;
        }
        case 'J': {
          sqlite3_snprintf(20, &z[j],"%.16g",x.iJD/86400000.0);
          j+=sqlite3Strlen30(&z[j]);
          break;
        }
        case 'm':  sqlite3_snprintf(3, &z[j],"%02d",x.M); j+=2; break;
        case 'M':  sqlite3_snprintf(3, &z[j],"%02d",x.m); j+=2; break;
        case 's': {
          sqlite3_snprintf(30,&z[j],"%lld",
                           (i64)(x.iJD/1000 - 21086676*(i64)10000));
          j += sqlite3Strlen30(&z[j]);
          break;
        }
        case 'S':  sqlite3_snprintf(3,&z[j],"%02d",(int)x.s); j+=2; break;
        case 'w': {
          z[j++] = (char)(((x.iJD+129600000)/86400000) % 7) + '0';
          break;
        }
        case 'Y': {
          sqlite3_snprintf(5,&z[j],"%04d",x.Y); j+=sqlite3Strlen30(&z[j]);
          break;
        }
        default:   z[j++] = '%'; break;
      }
    }
  }
  z[j] = 0;
  sqlite3_result_text(context, z, -1,
                      z==zBuf ? SQLITE_TRANSIENT : SQLITE_DYNAMIC);
}